

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane-test.c++
# Opt level: O2

void __thiscall
capnp::_::anon_unknown_0::MembranePolicyImpl::~MembranePolicyImpl(MembranePolicyImpl *this)

{
  (this->super_MembranePolicy)._vptr_MembranePolicy = (_func_int **)&PTR_inboundCall_0064d298;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&PTR_disposeImpl_0064d310;
  kj::_::NullableValue<kj::ForkedPromise<void>_>::~NullableValue(&(this->revokePromise).ptr);
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  MembranePolicy::~MembranePolicy(&this->super_MembranePolicy);
  return;
}

Assistant:

MembranePolicyImpl() = default;